

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O1

uo_cb * uo_cb_clone(uo_cb *cb)

{
  void **__src;
  size_t sVar1;
  uo_linklist *puVar2;
  uo_linklist *puVar3;
  uo_linklist *puVar4;
  uo_cb *puVar5;
  void **ppvVar6;
  ulong uVar7;
  ulong uVar8;
  uo_linklist *puVar9;
  long in_FS_OFFSET;
  
  puVar5 = uo_cb_create();
  __src = (cb->stack).items;
  sVar1 = (cb->stack).count;
  uVar8 = (puVar5->stack).count + sVar1;
  if ((puVar5->stack).capacity < uVar8) {
    uVar7 = uVar8 - 1 >> 1 | uVar8 - 1;
    uVar7 = uVar7 >> 2 | uVar7;
    uVar7 = uVar7 >> 4 | uVar7;
    uVar7 = uVar7 >> 8 | uVar7;
    uVar7 = uVar7 >> 0x10 | uVar7;
    uVar7 = uVar7 >> 0x20 | uVar7;
    (puVar5->stack).capacity = uVar7 + 1;
    ppvVar6 = (void **)realloc((puVar5->stack).items,uVar7 * 8 + 8);
    (puVar5->stack).items = ppvVar6;
  }
  memcpy((puVar5->stack).items + (puVar5->stack).count,__src,sVar1 << 3);
  (puVar5->stack).count = uVar8;
  puVar9 = (cb->funclist).next;
  if (puVar9 != &cb->funclist) {
    do {
      puVar2 = puVar9[1].next;
      uo_cb_func_linkpool_grow(0x20);
      puVar3 = *(uo_linklist **)(in_FS_OFFSET + -0x20);
      puVar4 = puVar3->next;
      puVar4->prev = puVar3->prev;
      puVar3->prev->next = puVar4;
      puVar3->next = (uo_linklist *)0x0;
      puVar3->prev = (uo_linklist *)0x0;
      puVar3[1].next = puVar2;
      puVar2 = (puVar5->funclist).prev;
      puVar3->prev = puVar2;
      puVar2->next = puVar3;
      puVar3->next = &puVar5->funclist;
      (puVar5->funclist).prev = puVar3;
      puVar9 = puVar9->next;
    } while (puVar9 != &cb->funclist);
  }
  return puVar5;
}

Assistant:

uo_cb *uo_cb_clone(
    const uo_cb *cb)
{
    uo_cb *cb_clone = uo_cb_create();
    uo_stack_push_arr(&cb_clone->stack, cb->stack.items, cb->stack.count);

    uo_linklist *link = cb->funclist.next;

    while (link != &cb->funclist)
    {
        uo_cb_append_func(cb_clone, ((uo_cb_func_linklist *)link)->item);
        link = link->next;
    }

    return cb_clone;
}